

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

float ImGui::TableGetColumnWidthAuto(ImGuiTable *table,ImGuiTableColumn *column)

{
  uint uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  auVar3 = vcmpss_avx(ZEXT416((uint)column->ContentMaxXUnfrozen),
                      ZEXT416((uint)column->ContentMaxXFrozen),2);
  auVar3 = vblendvps_avx(ZEXT416((uint)column->ContentMaxXUnfrozen),
                         ZEXT416((uint)column->ContentMaxXFrozen),auVar3);
  fVar2 = auVar3._0_4_ - column->WorkMinX;
  auVar3 = ZEXT416((uint)fVar2);
  uVar1 = column->Flags;
  if ((uVar1 >> 0xb & 1) == 0) {
    auVar4 = ZEXT416((uint)(column->ContentMaxXHeadersIdeal - column->WorkMinX));
    auVar3 = vcmpss_avx(auVar4,ZEXT416((uint)fVar2),2);
    auVar3 = vblendvps_avx(auVar4,ZEXT416((uint)fVar2),auVar3);
  }
  if (((uVar1 & 8) != 0) && (fVar2 = column->InitStretchWeightOrWidth, 0.0 < fVar2)) {
    if ((table->Flags & 1) == 0) {
      auVar3 = ZEXT416((uint)fVar2);
    }
    if ((uVar1 & 0x10) != 0) {
      auVar3 = ZEXT416((uint)fVar2);
    }
  }
  auVar4 = vcmpss_avx(ZEXT416((uint)table->MinColumnWidth),auVar3,2);
  auVar3 = vblendvps_avx(ZEXT416((uint)table->MinColumnWidth),auVar3,auVar4);
  return auVar3._0_4_;
}

Assistant:

float ImGui::TableGetColumnWidthAuto(ImGuiTable* table, ImGuiTableColumn* column)
{
    const float content_width_body = ImMax(column->ContentMaxXFrozen, column->ContentMaxXUnfrozen) - column->WorkMinX;
    const float content_width_headers = column->ContentMaxXHeadersIdeal - column->WorkMinX;
    float width_auto = content_width_body;
    if (!(column->Flags & ImGuiTableColumnFlags_NoHeaderWidth))
        width_auto = ImMax(width_auto, content_width_headers);

    // Non-resizable fixed columns preserve their requested width
    if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && column->InitStretchWeightOrWidth > 0.0f)
        if (!(table->Flags & ImGuiTableFlags_Resizable) || (column->Flags & ImGuiTableColumnFlags_NoResize))
            width_auto = column->InitStretchWeightOrWidth;

    return ImMax(width_auto, table->MinColumnWidth);
}